

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_ScrollCallback(GLFWwindow *window,double xoffset,double yoffset)

{
  ImGuiIO *pIVar1;
  ImGuiIO *io;
  double yoffset_local;
  double xoffset_local;
  GLFWwindow *window_local;
  
  if (g_PrevUserCallbackScroll != (GLFWscrollfun)0x0) {
    (*g_PrevUserCallbackScroll)(window,xoffset,yoffset);
  }
  pIVar1 = ImGui::GetIO();
  pIVar1->MouseWheelH = (float)xoffset + pIVar1->MouseWheelH;
  pIVar1->MouseWheel = (float)yoffset + pIVar1->MouseWheel;
  return;
}

Assistant:

void ImGui_ImplGlfw_ScrollCallback(GLFWwindow* window, double xoffset, double yoffset)
{
    if (g_PrevUserCallbackScroll != NULL)
        g_PrevUserCallbackScroll(window, xoffset, yoffset);

    ImGuiIO& io = ImGui::GetIO();
    io.MouseWheelH += (float)xoffset;
    io.MouseWheel += (float)yoffset;
}